

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_address.c
# Opt level: O0

CMimeAddress_T * cmime_address_parse_string(char *s)

{
  int iVar1;
  CMimeAddress_T *pCVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  int offset;
  int size_in;
  char *t1;
  CMimeAddress_T *ca;
  char *s_local;
  
  pCVar2 = cmime_address_new();
  sVar3 = strlen(s);
  iVar1 = (int)sVar3;
  pcVar4 = strrchr(s,0x3c);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)calloc((long)iVar1 + 1,1);
    pCVar2->email = pcVar4;
    strncpy(pCVar2->email,s,(long)iVar1);
    pcVar4 = pCVar2->email;
    sVar3 = strlen(pCVar2->email);
    pcVar4[sVar3] = '\0';
  }
  else {
    sVar3 = strlen(pcVar4);
    iVar1 = iVar1 - (int)sVar3;
    if (0 < iVar1) {
      pcVar5 = (char *)calloc((long)iVar1 + 1,1);
      pCVar2->name = pcVar5;
      strncpy(pCVar2->name,s,(long)iVar1);
      pcVar5 = pCVar2->name;
      sVar3 = strlen(pCVar2->name);
      pcVar5[sVar3] = '\0';
    }
    sVar3 = strlen(pcVar4);
    pcVar5 = (char *)calloc(sVar3 + 1,1);
    pCVar2->email = pcVar5;
    strcpy(pCVar2->email,pcVar4);
  }
  pCVar2->parsed = 1;
  return pCVar2;
}

Assistant:

CMimeAddress_T *cmime_address_parse_string(const char *s) {
    CMimeAddress_T *ca = cmime_address_new();
    char *t1 = NULL;
    int size_in;
    int offset;

    size_in = strlen(s);
    t1 = strrchr(s,'<');
    if (t1 != NULL) {
        offset = size_in - strlen(t1);

        if (offset > 0) {
            ca->name = (char *)calloc(offset + sizeof(char),sizeof(char));
            strncpy(ca->name,s,offset);
            ca->name[strlen(ca->name)] = '\0';
        }

        ca->email = (char *)calloc(strlen(t1) + sizeof(char),sizeof(char));
        strcpy(ca->email,t1);
    }   else {
        ca->email = (char *)calloc(size_in + sizeof(char),sizeof(char));
        strncpy(ca->email,s,size_in);
        ca->email[strlen(ca->email)] = '\0';
    }

    ca->parsed = 1;
    return(ca);
}